

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

bool __thiscall BinNE<0,_0,_0>::propagate(BinNE<0,_0,_0> *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  IntVar *pIVar5;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar6;
  byte bVar7;
  IntVar *pIVar8;
  int64_t m_v;
  
  pIVar8 = (this->x).var;
  iVar2 = (pIVar8->min).v;
  iVar4 = (pIVar8->max).v;
  if (iVar2 == iVar4) {
    pIVar5 = (this->y).var;
    iVar1 = (pIVar5->min).v;
    iVar4 = iVar2;
    if ((iVar2 == iVar1) && (iVar1 == (pIVar5->max).v)) {
      uVar3 = (this->r).v;
      bVar7 = (this->r).s;
      if ((uint)bVar7 * 2 + -1 != (int)sat.assigns.data[uVar3]) {
        if (so.lazy) {
          iVar2 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[10])();
          uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
          r._a = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
          uVar3 = (this->r).v;
          bVar7 = (this->r).s;
        }
        else {
          r._pt = (Clause *)0x0;
        }
        SAT::cEnqueue(&sat,(Lit)((uint)(bVar7 ^ 1) + uVar3 * 2),(Reason)r);
        if (sat.confl != (Clause *)0x0) {
          return false;
        }
        pIVar8 = (this->x).var;
        iVar2 = (pIVar8->min).v;
        iVar4 = (pIVar8->max).v;
        goto LAB_001b4403;
      }
    }
  }
  else {
LAB_001b4403:
    if (iVar2 != iVar4) goto LAB_001b4468;
  }
  pIVar5 = (this->y).var;
  if (((pIVar5->min).v <= iVar4) && (iVar4 <= (pIVar5->max).v)) {
    if ((pIVar5->vals == (Tchar *)0x0) || (pIVar5->vals[iVar4].v != '\0')) {
      if (so.lazy == true) {
        iVar2 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[10])();
        lVar6 = (long)iVar2 * 4 + 2;
        pIVar5 = (this->y).var;
      }
      else {
        lVar6 = 0;
      }
      iVar2 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0x11])
                        (pIVar5,(long)iVar4,lVar6,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
    }
  }
LAB_001b4468:
  pIVar8 = (this->y).var;
  iVar2 = (pIVar8->min).v;
  if (iVar2 != (pIVar8->max).v) {
    return true;
  }
  pIVar5 = (this->x).var;
  if (iVar2 < (pIVar5->min).v) {
    return true;
  }
  if ((pIVar5->max).v < iVar2) {
    return true;
  }
  if ((pIVar5->vals != (Tchar *)0x0) && (pIVar5->vals[iVar2].v == '\0')) {
    return true;
  }
  if (so.lazy == true) {
    iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[10])(pIVar8);
    lVar6 = (long)iVar4 * 4 + 2;
    pIVar5 = (this->x).var;
  }
  else {
    lVar6 = 0;
  }
  iVar2 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0x11])(pIVar5,(long)iVar2,lVar6,1);
  if ((char)iVar2 == '\0') {
    return false;
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		if (x.isFixed() && y.isFixed() && x.getVal() == y.getVal()) {
			setDom(r, setVal, 0, x.getValLit(), y.getValLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		if (x.isFixed()) {
			if (R != 0) {
				setDom(y, remVal, x.getVal(), x.getValLit(), r.getValLit());
			} else {
				setDom(y, remVal, x.getVal(), x.getValLit());
			}
		}
		if (y.isFixed()) {
			if (R != 0) {
				setDom(x, remVal, y.getVal(), y.getValLit(), r.getValLit());
			} else {
				setDom(x, remVal, y.getVal(), y.getValLit());
			}
		}

		return true;
	}